

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

int run_test_ipc_tcp_connection(void)

{
  undefined8 uVar1;
  char *pcVar2;
  
  run_ipc_test("ipc_helper_tcp_connection",on_read_connection);
  if (read_cb_called == 1) {
    if (tcp_write_cb_called == 1) {
      if (tcp_read_cb_called == 1) {
        if (exit_cb_called == 1) {
          return 0;
        }
        pcVar2 = "exit_cb_called == 1";
        uVar1 = 0x1ec;
      }
      else {
        pcVar2 = "tcp_read_cb_called == 1";
        uVar1 = 0x1eb;
      }
    }
    else {
      pcVar2 = "tcp_write_cb_called == 1";
      uVar1 = 0x1ea;
    }
  }
  else {
    pcVar2 = "read_cb_called == 1";
    uVar1 = 0x1e9;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
          ,uVar1,pcVar2);
  abort();
}

Assistant:

TEST_IMPL(ipc_tcp_connection) {
#if defined(NO_SEND_HANDLE_ON_PIPE)
  RETURN_SKIP(NO_SEND_HANDLE_ON_PIPE);
#endif
  int r = run_ipc_test("ipc_helper_tcp_connection", on_read_connection);
  ASSERT(read_cb_called == 1);
  ASSERT(tcp_write_cb_called == 1);
  ASSERT(tcp_read_cb_called == 1);
  ASSERT(exit_cb_called == 1);
  return r;
}